

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

ON_ClippingPlaneData *
GetClippingPlaneData(ON_ClippingPlaneDataStore *dataStore,bool createIfMissing)

{
  ON_ClippingPlaneData *pOVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ON_ClippingPlaneData *unaff_R15;
  
  bVar3 = ON_SleepLock::GetLock(&g_data_list_lock);
  if ((dataStore->m_sn != 0) && (0 < (long)g_data_list.m_list.m_count)) {
    lVar4 = 0;
    do {
      pOVar1 = g_data_list.m_list.m_a[lVar4];
      if ((pOVar1 == (ON_ClippingPlaneData *)0x0) || (pOVar1->m_sn != dataStore->m_sn)) {
        bVar2 = true;
      }
      else {
        bVar2 = false;
        unaff_R15 = pOVar1;
      }
      if (!bVar2) goto LAB_00574763;
      lVar4 = lVar4 + 1;
    } while (g_data_list.m_list.m_count != lVar4);
  }
  unaff_R15 = (ON_ClippingPlaneData *)0x0;
LAB_00574763:
  if (unaff_R15 == (ON_ClippingPlaneData *)0x0) {
    unaff_R15 = ON_ClippingPlaneDataList::AppendNew(&g_data_list);
    if (unaff_R15 == (ON_ClippingPlaneData *)0x0) {
      unaff_R15 = (ON_ClippingPlaneData *)0x0;
    }
    else {
      dataStore->m_sn = unaff_R15->m_sn;
    }
  }
  if (bVar3) {
    ON_SleepLock::ReturnLock(&g_data_list_lock);
  }
  return unaff_R15;
}

Assistant:

static ON_ClippingPlaneData* GetClippingPlaneData(ON_ClippingPlaneDataStore& dataStore, bool createIfMissing)
{
  bool bReturnLock = g_data_list_lock.GetLock();

  ON_ClippingPlaneData* rc = g_data_list.FromSerialNumber(dataStore.m_sn);
  if (nullptr==rc && createIfMissing)
  {
    rc = g_data_list.AppendNew();
    if (rc)
      dataStore.m_sn = rc->m_sn;
  }
  if(bReturnLock)
    g_data_list_lock.ReturnLock();
  return rc;
}